

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeSetPrototype
               (DynamicObject *setPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar4;
  JavascriptFunction *pJVar2;
  JavascriptString *pJVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,setPrototype,mode,0xc,1);
  this = (((setPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (setPrototype,0x67,(this->super_JavascriptLibraryBase).setConstructor.ptr,6,0,0,uVar5);
  AddFunctionToLibraryObject
            (this,setPrototype,0x4a,(FunctionInfo *)JavascriptSet::EntryInfo::Add,1,'\x06');
  AddFunctionToLibraryObject
            (this,setPrototype,0x62,(FunctionInfo *)JavascriptSet::EntryInfo::Clear,0,'\x06');
  AddFunctionToLibraryObject
            (this,setPrototype,0x6f,(FunctionInfo *)JavascriptSet::EntryInfo::Delete,1,'\x06');
  AddFunctionToLibraryObject
            (this,setPrototype,0x93,(FunctionInfo *)JavascriptSet::EntryInfo::ForEach,1,'\x06');
  AddFunctionToLibraryObject
            (this,setPrototype,0xb4,(FunctionInfo *)JavascriptSet::EntryInfo::Has,1,'\x06');
  AddAccessorsToLibraryObject
            (this,setPrototype,0x14f,(FunctionInfo *)JavascriptSet::EntryInfo::SizeGetter,
             (FunctionInfo *)0x0);
  AddFunctionToLibraryObject
            (this,setPrototype,0x7a,(FunctionInfo *)JavascriptSet::EntryInfo::Entries,0,'\x06');
  pJVar2 = AddFunctionToLibraryObject
                     (this,setPrototype,399,(FunctionInfo *)JavascriptSet::EntryInfo::Values,0,
                      '\x06');
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0xcf,pJVar2,6,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x14,pJVar2,6,0,0,uVar5);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar3 = CreateStringFromCppLiteral<4ul>(this,(char16 (*) [4])0xff3a38);
    (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x1b,pJVar3,2,0,0,uVar5 & 0xffffffff00000000)
    ;
  }
  DynamicObject::SetHasNoEnumerableProperties(setPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetPrototype(DynamicObject* setPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setPrototype, mode, 12, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSet
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = setPrototype->GetScriptContext();
        JavascriptLibrary* library = setPrototype->GetLibrary();
        library->AddMember(setPrototype, PropertyIds::constructor, library->setConstructor);

        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::add, &JavascriptSet::EntryInfo::Add, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::clear, &JavascriptSet::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::delete_, &JavascriptSet::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::forEach, &JavascriptSet::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::has, &JavascriptSet::EntryInfo::Has, 1);

        library->AddAccessorsToLibraryObject(setPrototype, PropertyIds::size, &JavascriptSet::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* valuesFunc;
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::entries, &JavascriptSet::EntryInfo::Entries, 0);
        valuesFunc = library->AddFunctionToLibraryObject(setPrototype, PropertyIds::values, &JavascriptSet::EntryInfo::Values, 0);
        library->AddMember(setPrototype, PropertyIds::keys, valuesFunc);
        library->AddMember(setPrototype, PropertyIds::_symbolIterator, valuesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(setPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Set")), PropertyConfigurable);
        }

        setPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }